

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint in_ECX;
  __m128i *in_RDX;
  uint in_ESI;
  CONV_BUF_TYPE *in_RDI;
  __m128i *in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i m1;
  __m128i m0;
  __m128i m1_ac;
  __m128i m0_ac;
  __m128i m_i01;
  __m128i m_i00;
  int j;
  int i;
  __m128i zeros;
  __m128i one_b;
  __m128i v_maxval;
  __m128i *in_stack_00000270;
  int in_stack_00000278;
  int local_150;
  int local_14c;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  uint8_t *dst_00;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  dst_00 = (uint8_t *)0x0;
  for (local_14c = 0; local_14c < in_stack_00000018; local_14c = local_14c + 1) {
    for (local_150 = 0; local_150 < (int)m1[0]; local_150 = local_150 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + (local_150 << 1)));
      xx_loadu_128((void *)(in_stack_00000008 + (local_150 << 1) + 0x10));
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = extraout_XMM0_Qa;
      auVar3._8_8_ = 0x101010101010101;
      auVar3._0_8_ = 0x101010101010101;
      auVar3 = pmaddubsw(auVar2,auVar3);
      auVar1._8_8_ = extraout_XMM0_Qb_00;
      auVar1._0_8_ = extraout_XMM0_Qa_00;
      auVar4._8_8_ = 0x101010101010101;
      auVar4._0_8_ = 0x101010101010101;
      auVar4 = pmaddubsw(auVar1,auVar4);
      local_38 = auVar3._0_2_;
      uStack_36 = auVar3._2_2_;
      uStack_34 = auVar3._4_2_;
      uStack_32 = auVar3._6_2_;
      uStack_30 = auVar3._8_2_;
      uStack_2e = auVar3._10_2_;
      uStack_2c = auVar3._12_2_;
      uStack_2a = auVar3._14_2_;
      pavgw(local_38,0);
      pavgw(uStack_36,0);
      pavgw(uStack_34,0);
      pavgw(uStack_32,0);
      pavgw(uStack_30,0);
      pavgw(uStack_2e,0);
      pavgw(uStack_2c,0);
      pavgw(uStack_2a,0);
      local_58 = auVar4._0_2_;
      uStack_56 = auVar4._2_2_;
      uStack_54 = auVar4._4_2_;
      uStack_52 = auVar4._6_2_;
      uStack_50 = auVar4._8_2_;
      uStack_4e = auVar4._10_2_;
      uStack_4c = auVar4._12_2_;
      uStack_4a = auVar4._14_2_;
      pavgw(local_58,0);
      pavgw(uStack_56,0);
      pavgw(uStack_54,0);
      pavgw(uStack_52,0);
      pavgw(uStack_50,0);
      pavgw(uStack_4e,0);
      pavgw(uStack_4c,0);
      pavgw(uStack_4a,0);
      blend_a64_d16_mask_w16_sse41
                (dst_00,in_RDI,(CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff08),in_RDX,
                 (__m128i *)CONCAT44(in_ECX,in_stack_fffffffffffffef8),in_R8,in_stack_00000270,
                 in_stack_00000278);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)in_stack_00000010;
    in_RDI = (CONV_BUF_TYPE *)((long)in_RDI + (ulong)in_ESI);
    in_RDX = (__m128i *)((long)*in_RDX + (ulong)in_ECX * 2);
    in_R8 = (__m128i *)((long)*in_R8 + (ulong)in_R9D * 2);
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m_i00 = xx_loadu_128(mask + 2 * j);
      const __m128i m_i01 = xx_loadu_128(mask + 2 * j + 16);
      const __m128i m0_ac = _mm_maddubs_epi16(m_i00, one_b);
      const __m128i m1_ac = _mm_maddubs_epi16(m_i01, one_b);
      const __m128i m0 = _mm_avg_epu16(m0_ac, zeros);
      const __m128i m1 = _mm_avg_epu16(m1_ac, zeros);

      blend_a64_d16_mask_w16_sse41(dst + j, src0 + j, src1 + j, &m0, &m1,
                                   round_offset, &v_maxval, shift);
    }
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}